

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O0

void Min_CoverCreate(Vec_Str_t *vCover,Min_Cube_t *pCover,char Type)

{
  Min_Cube_t *local_28;
  Min_Cube_t *pCube;
  char Type_local;
  Min_Cube_t *pCover_local;
  Vec_Str_t *vCover_local;
  
  if (pCover != (Min_Cube_t *)0x0) {
    Vec_StrClear(vCover);
    for (local_28 = pCover; local_28 != (Min_Cube_t *)0x0; local_28 = local_28->pNext) {
      Min_CubeCreate(vCover,local_28,Type);
    }
    Vec_StrPush(vCover,'\0');
    return;
  }
  __assert_fail("pCover != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covMinUtil.c"
                ,0x58,"void Min_CoverCreate(Vec_Str_t *, Min_Cube_t *, char)");
}

Assistant:

void Min_CoverCreate( Vec_Str_t * vCover, Min_Cube_t * pCover, char Type )
{
    Min_Cube_t * pCube;
    assert( pCover != NULL );
    Vec_StrClear( vCover );
    Min_CoverForEachCube( pCover, pCube )
        Min_CubeCreate( vCover, pCube, Type );
    Vec_StrPush( vCover, 0 );
}